

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cpp
# Opt level: O2

bool __thiscall utf8stream::seek(utf8stream *this,offset off,int whence)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  uchar skip [512];
  undefined1 auStack_238 [520];
  
  if ((this->writing == false) && (this->reading == true)) {
    if (whence == 1) {
      lVar2 = this->pos;
      off = off + lVar2;
    }
    else {
      if (whence == 2) {
        do {
          iVar1 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,0x200);
        } while (iVar1 == 0x200);
        return off == 0;
      }
      lVar2 = this->pos;
    }
    uVar4 = off - lVar2;
    if (off < lVar2) {
      if (off < 0) goto LAB_00154979;
      iVar1 = (*this->file->_vptr_stream[6])(this->file,0,0);
      if ((char)iVar1 == '\0') {
        return false;
      }
      this->pos = 0;
      this->bufread = 0;
      this->bufcarry = 0;
      this->buflen = 0;
      checkheader(this);
      uVar4 = off;
    }
    do {
      bVar5 = (long)uVar4 < 1;
      if ((long)uVar4 < 1) {
        return bVar5;
      }
      uVar3 = 0x200;
      if (uVar4 < 0x200) {
        uVar3 = uVar4;
      }
      iVar1 = (*(this->super_stream)._vptr_stream[9])(this,auStack_238,uVar3 & 0xffffffff);
      uVar4 = uVar4 - uVar3;
    } while (iVar1 == (int)uVar3);
    if (this->reading == true) {
      this->reading = false;
    }
  }
  else {
LAB_00154979:
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool seek(offset off, int whence)
    {
        if(writing || !reading) return false;

        if(whence == SEEK_END)
        {
            uchar skip[512];
            while(read(skip, sizeof(skip)) == sizeof(skip));
            return !off;
        }
        else if(whence == SEEK_CUR) off += pos;

        if(off >= pos) off -= pos;
        else if(off < 0 || !file->seek(0, SEEK_SET)) return false;
        else
        {
            bufread = bufcarry = buflen = 0;
            pos = 0;
            checkheader();
        }

        uchar skip[512];
        while(off > 0)
        {
            int skipped = (int)min(off, (offset)sizeof(skip));
            if(read(skip, skipped) != skipped) { stopreading(); return false; }
            off -= skipped;
        }

        return true;
    }